

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O3

Error asmjit::v1_14::arm::FormatterInternal::formatOperand
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  undefined3 uVar1;
  Error EVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  RegType RVar6;
  ShiftOp shiftOp;
  FormatFlags FVar7;
  StringFormatFlags SVar8;
  BaseReg *reg;
  
  uVar3 = (op->_signature)._bits;
  uVar1 = (undefined3)(uVar3 >> 8);
  switch(uVar3 & 7) {
  case 1:
    uVar5 = 0xffffffff;
    if ((short)uVar3 < 0) {
      uVar5 = uVar3 >> 0x10 & 0xf;
    }
    RVar6 = (byte)uVar3 >> 3;
    EVar2 = formatRegister(sb,CONCAT31(uVar1,RVar6),emitter,arch,RVar6,op->_baseId,uVar3 >> 0xc & 7,
                           uVar5);
    break;
  case 2:
    FVar7 = kMachineCode;
    EVar2 = String::_opChar(sb,kAppend,'[');
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar3 = (op->_signature)._bits;
    uVar4 = (ulong)uVar3;
    if ((uVar3 & 0xf8) == 0) {
      if ((uVar3 & 0x1f00) != 0) {
LAB_0012bb4b:
        EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
        goto LAB_0012bb9f;
      }
      uVar5 = 0;
      if ((uVar3 & 0xf8) == 0) {
        uVar5 = op->_baseId;
      }
      if (uVar5 != 0 || op->_data[1] != 0) goto LAB_0012bb4b;
    }
    else {
      if ((uVar3 & 0xf8) == 8) {
        EVar2 = Formatter::formatLabel(sb,flags,emitter,op->_baseId);
      }
      else {
        if ((uVar3 >> 0xd & 1) != 0) {
          FVar7 = kMachineCode;
          EVar2 = String::_opChar(sb,kAppend,'&');
          if (EVar2 != 0) {
            return EVar2;
          }
          uVar4 = (ulong)(byte)(op->_signature)._bits;
        }
        EVar2 = formatRegister(sb,FVar7,emitter,arch,(RegType)(uVar4 >> 3) & kMaxValue,op->_baseId,0
                               ,0xffffffff);
      }
LAB_0012bb9f:
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    uVar3 = (op->_signature)._bits;
    if ((uVar3 & 0x3000000) == 0x2000000) {
      EVar2 = String::_opChar(sb,kAppend,']');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if ((uVar3 & 0x1f00) != 0) {
      FVar7 = kMachineCode;
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      EVar2 = formatRegister(sb,FVar7,emitter,arch,
                             (RegType)((op->_signature)._bits >> 8) & kMaxValue,op->_data[0],0,
                             0xffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    uVar5 = 0;
    if ((uVar3 & 0xf8) == 0) {
      uVar5 = op->_baseId;
    }
    if (uVar5 != 0 || op->_data[1] != 0) {
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar4 = CONCAT44(op->_baseId,op->_data[1]);
      if (((op->_signature)._bits & 0xf8) != 0) {
        uVar4 = (long)(int)op->_data[1];
      }
      if (((flags & kHexOffsets) == kNone) || (uVar4 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar2 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar2 = String::_opNumber(sb,kAppend,uVar4,uVar5,0,SVar8);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    uVar3 = (op->_signature)._bits;
    if ((uVar3 & 0x7c000) != 0) {
      EVar2 = String::_opChar(sb,kAppend,' ');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
      if ((uVar3 & 0x3000000) == 0) {
        EVar2 = formatShiftOp(sb,uVar3 >> 0x14 & (kSXTW|kROR));
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar3 = (op->_signature)._bits;
      }
      EVar2 = String::_opFormat(sb,kAppend," %u",(ulong)(uVar3 >> 0xe & 0x1f));
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if ((uVar3 & 0x3000000) != 0x2000000) {
      EVar2 = String::_opChar(sb,kAppend,']');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar3 = (op->_signature)._bits;
    }
    if (((uVar3 & 0x3000000) != 0x1000000) || (EVar2 = String::_opChar(sb,kAppend,'!'), EVar2 == 0))
    {
      EVar2 = 0;
    }
    break;
  case 3:
    RVar6 = (byte)uVar3 >> 3;
    EVar2 = formatRegisterList(sb,CONCAT31(uVar1,RVar6),emitter,arch,RVar6,op->_baseId);
    return EVar2;
  case 4:
    uVar4 = *(ulong *)op->_data;
    shiftOp = uVar3 >> 0x14 & (kSXTW|kROR);
    if ((shiftOp == kLSL) ||
       ((EVar2 = formatShiftOp(sb,shiftOp), EVar2 == 0 &&
        (EVar2 = String::_opChar(sb,kAppend,' '), EVar2 == 0)))) {
      if (((flags & kHexImms) == kNone) || (uVar4 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar2 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar2 = String::_opNumber(sb,kAppend,uVar4,uVar5,0,SVar8);
      return EVar2;
    }
    break;
  case 5:
    EVar2 = Formatter::formatLabel(sb,flags,emitter,op->_baseId);
    return EVar2;
  default:
    EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar2;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg()) {
    const BaseReg& reg = op.as<BaseReg>();

    uint32_t elementType = op._signature.getField<BaseVec::kSignatureRegElementTypeMask>();
    uint32_t elementIndex = op.as<BaseVec>().elementIndex();

    if (!op.as<BaseVec>().hasElementIndex())
      elementIndex = 0xFFFFFFFFu;

    return formatRegister(sb, flags, emitter, arch, reg.type(), reg.id(), elementType, elementIndex);
  }

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append('['));

    if (m.hasBase()) {
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, flags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = flags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append('&'));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }
    else {
      // ARM really requires base.
      if (m.hasIndex() || m.hasOffset()) {
        ASMJIT_PROPAGATE(sb.append("<None>"));
      }
    }

    // The post index makes it look like there was another operand, but it's
    // still the part of AsmJit's `arm::Mem` operand so it's consistent with
    // other architectures.
    if (m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.hasIndex()) {
      ASMJIT_PROPAGATE(sb.append(", "));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, m.indexType(), m.indexId()));
    }

    if (m.hasOffset()) {
      ASMJIT_PROPAGATE(sb.append(", "));

      int64_t off = int64_t(m.offset());
      uint32_t base = 10;

      if (Support::test(flags, FormatFlags::kHexOffsets) && uint64_t(off) > 9)
        base = 16;

      if (base == 10) {
        ASMJIT_PROPAGATE(sb.appendInt(off, base));
      }
      else {
        ASMJIT_PROPAGATE(sb.append("0x"));
        ASMJIT_PROPAGATE(sb.appendUInt(uint64_t(off), base));
      }
    }

    if (m.hasShift()) {
      ASMJIT_PROPAGATE(sb.append(' '));
      if (!m.isPreOrPost())
        ASMJIT_PROPAGATE(formatShiftOp(sb, m.shiftOp()));
      ASMJIT_PROPAGATE(sb.appendFormat(" %u", m.shift()));
    }

    if (!m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.isPreIndex())
      ASMJIT_PROPAGATE(sb.append('!'));

    return kErrorOk;
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();
    uint32_t predicate = i.predicate();

    if (predicate) {
      ASMJIT_PROPAGATE(formatShiftOp(sb, ShiftOp(predicate)));
      ASMJIT_PROPAGATE(sb.append(' '));
    }

    if (Support::test(flags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x"));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, flags, emitter, op.id());
  }

  if (op.isRegList()) {
    const BaseRegList& regList = op.as<BaseRegList>();
    return formatRegisterList(sb, flags, emitter, arch, regList.type(), regList.list());
  }

  return sb.append("<None>");
}